

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toktx.cc
# Opt level: O1

unique_ptr<Image,_std::default_delete<Image>_> __thiscall
toktxApp::convertImageType(toktxApp *this,unique_ptr<Image,_std::default_delete<Image>_> *pImage)

{
  undefined4 uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  int iVar4;
  int iVar5;
  ImageT<unsigned_short,_4U> *this_00;
  long lVar6;
  runtime_error *this_01;
  long *in_RDX;
  pointer *__ptr;
  string nullSwizzle;
  long *local_50;
  undefined8 local_48;
  long local_40 [2];
  
  iVar5 = *(int *)&pImage[100]._M_t.super___uniq_ptr_impl<Image,_std::default_delete<Image>_>._M_t.
                   super__Tuple_impl<0UL,_Image_*,_std::default_delete<Image>_>.
                   super__Head_base<0UL,_Image_*,_false>._M_head_impl;
  iVar4 = (**(code **)(*(long *)*in_RDX + 0x28))();
  if (iVar5 == iVar4) {
    (this->super_scApp).super_ktxApp._vptr_ktxApp = (_func_int **)*in_RDX;
    *in_RDX = 0;
    return (unique_ptr<Image,_std::default_delete<Image>_>)this;
  }
  (this->super_scApp).super_ktxApp._vptr_ktxApp = (_func_int **)0x0;
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"rgba","");
  iVar5 = (**(code **)(*(long *)*in_RDX + 0x30))();
  uVar1 = *(undefined4 *)
           &pImage[100]._M_t.super___uniq_ptr_impl<Image,_std::default_delete<Image>_>._M_t.
            super__Tuple_impl<0UL,_Image_*,_std::default_delete<Image>_>.
            super__Head_base<0UL,_Image_*,_false>._M_head_impl;
  if (iVar5 == 2) {
    switch(uVar1) {
    case 0:
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/toktx/toktx.cc"
                    ,0x487,"unique_ptr<Image> toktxApp::convertImageType(unique_ptr<Image>)");
    case 1:
      uVar2 = *(uint32_t *)(*in_RDX + 8);
      uVar3 = *(uint32_t *)(*in_RDX + 0xc);
      this_00 = (ImageT<unsigned_short,_4U> *)operator_new(0x28);
      ImageT<unsigned_short,_1U>::ImageT((ImageT<unsigned_short,_1U> *)this_00,uVar2,uVar3);
      goto LAB_00110e8f;
    case 2:
      uVar2 = *(uint32_t *)(*in_RDX + 8);
      uVar3 = *(uint32_t *)(*in_RDX + 0xc);
      this_00 = (ImageT<unsigned_short,_4U> *)operator_new(0x28);
      ImageT<unsigned_short,_2U>::ImageT((ImageT<unsigned_short,_2U> *)this_00,uVar2,uVar3);
LAB_00110ee6:
      (this->super_scApp).super_ktxApp._vptr_ktxApp = (_func_int **)this_00;
      lVar6 = 0xb8;
      break;
    case 3:
      uVar2 = *(uint32_t *)(*in_RDX + 8);
      uVar3 = *(uint32_t *)(*in_RDX + 0xc);
      this_00 = (ImageT<unsigned_short,_4U> *)operator_new(0x28);
      ImageT<unsigned_short,_3U>::ImageT((ImageT<unsigned_short,_3U> *)this_00,uVar2,uVar3);
LAB_00110f91:
      (this->super_scApp).super_ktxApp._vptr_ktxApp = (_func_int **)this_00;
      lVar6 = 0xc0;
      break;
    case 4:
      uVar2 = *(uint32_t *)(*in_RDX + 8);
      uVar3 = *(uint32_t *)(*in_RDX + 0xc);
      this_00 = (ImageT<unsigned_short,_4U> *)operator_new(0x28);
      ImageT<unsigned_short,_4U>::ImageT(this_00,uVar2,uVar3);
LAB_00110f3d:
      (this->super_scApp).super_ktxApp._vptr_ktxApp = (_func_int **)this_00;
      lVar6 = 200;
      break;
    default:
      goto switchD_00110e2a_default;
    }
  }
  else {
    switch(uVar1) {
    case 0:
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/toktx/toktx.cc"
                    ,0x49c,"unique_ptr<Image> toktxApp::convertImageType(unique_ptr<Image>)");
    case 1:
      uVar2 = *(uint32_t *)(*in_RDX + 8);
      uVar3 = *(uint32_t *)(*in_RDX + 0xc);
      this_00 = (ImageT<unsigned_short,_4U> *)operator_new(0x28);
      ImageT<unsigned_char,_1U>::ImageT((ImageT<unsigned_char,_1U> *)this_00,uVar2,uVar3);
      break;
    case 2:
      uVar2 = *(uint32_t *)(*in_RDX + 8);
      uVar3 = *(uint32_t *)(*in_RDX + 0xc);
      this_00 = (ImageT<unsigned_short,_4U> *)operator_new(0x28);
      ImageT<unsigned_char,_2U>::ImageT((ImageT<unsigned_char,_2U> *)this_00,uVar2,uVar3);
      goto LAB_00110ee6;
    case 3:
      uVar2 = *(uint32_t *)(*in_RDX + 8);
      uVar3 = *(uint32_t *)(*in_RDX + 0xc);
      this_00 = (ImageT<unsigned_short,_4U> *)operator_new(0x28);
      ImageT<unsigned_char,_3U>::ImageT((ImageT<unsigned_char,_3U> *)this_00,uVar2,uVar3);
      goto LAB_00110f91;
    case 4:
      uVar2 = *(uint32_t *)(*in_RDX + 8);
      uVar3 = *(uint32_t *)(*in_RDX + 0xc);
      this_00 = (ImageT<unsigned_short,_4U> *)operator_new(0x28);
      ImageT<unsigned_char,_4U>::ImageT((ImageT<unsigned_char,_4U> *)this_00,uVar2,uVar3);
      goto LAB_00110f3d;
    default:
      goto switchD_00110e2a_default;
    }
LAB_00110e8f:
    (this->super_scApp).super_ktxApp._vptr_ktxApp = (_func_int **)this_00;
    lVar6 = 0xb0;
  }
  (**(code **)(*(long *)*in_RDX + lVar6))((long *)*in_RDX,this_00,local_48,local_50);
switchD_00110e2a_default:
  if ((this->super_scApp).super_ktxApp._vptr_ktxApp != (_func_int **)0x0) {
    if (local_50 != local_40) {
      operator_delete(local_50,local_40[0] + 1);
    }
    return (__uniq_ptr_data<Image,_std::default_delete<Image>,_true,_true>)
           (__uniq_ptr_data<Image,_std::default_delete<Image>,_true,_true>)this;
  }
  this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_01,"Out of memory for image with new target type.");
  __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

unique_ptr<Image>
toktxApp::convertImageType(unique_ptr<Image> pImage)
{
    // TODO: These copyTo's should be reversed. The image should have
    // a copy constructor for each componentCount src image.
    if (options.targetType != (int)pImage->getComponentCount()) {
        unique_ptr<Image> newImage;
        string nullSwizzle = "rgba";
        // The casts in the following copyTo* definitions only work
        // because, thanks to the switch, at runtime we always pass
        // the image type being cast to.
        if (pImage->getComponentSize() == 2) {
            switch (options.targetType) {
              case commandOptions::eR:
                newImage = make_unique<r16image>(pImage->getWidth(), pImage->getHeight());
                pImage->copyToR(*newImage, nullSwizzle);
                break;
              case commandOptions::eRG:
                newImage = make_unique<rg16image>(pImage->getWidth(), pImage->getHeight());
                pImage->copyToRG(*newImage, nullSwizzle);
                break;
              case commandOptions::eRGB:
                newImage = make_unique<rgb16image>(pImage->getWidth(), pImage->getHeight());
                pImage->copyToRGB(*newImage, nullSwizzle);
                break;
              case commandOptions::eRGBA:
                newImage = make_unique<rgba16image>(pImage->getWidth(), pImage->getHeight());
                pImage->copyToRGBA(*newImage, nullSwizzle);
                break;
              case commandOptions::eUnspecified:
                assert(false);
            }
        } else {
            switch (options.targetType) {
              case commandOptions::eR:
                newImage = make_unique<r8image>(pImage->getWidth(), pImage->getHeight());
                pImage->copyToR(*newImage, nullSwizzle);
                break;
              case commandOptions::eRG:
                newImage = make_unique<rg8image>(pImage->getWidth(), pImage->getHeight());
                pImage->copyToRG(*newImage, nullSwizzle);
                break;
              case commandOptions::eRGB:
                newImage = make_unique<rgb8image>(pImage->getWidth(), pImage->getHeight());
                pImage->copyToRGB(*newImage, nullSwizzle);
                break;
              case commandOptions::eRGBA:
                newImage = make_unique<rgba8image>(pImage->getWidth(), pImage->getHeight());
                pImage->copyToRGBA(*newImage, nullSwizzle);
                break;
              case commandOptions::eUnspecified:
                assert(false);
            }
        }
        if (newImage) {
             return newImage;
        } else {
            throw runtime_error(
                "Out of memory for image with new target type."
            );
        }
    }
    return pImage;
}